

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_utils.hpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::NextvalBindData::Copy(NextvalBindData *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = *(_func_int **)(in_RSI + 8);
  pp_Var2 = (_func_int **)operator_new(0x18);
  *pp_Var2 = (_func_int *)&PTR__NextvalBindData_02493d90;
  pp_Var2[1] = p_Var1;
  (**(code **)(*(long *)p_Var1 + 0x40))(pp_Var2 + 2,p_Var1);
  (this->super_FunctionData)._vptr_FunctionData = pp_Var2;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<NextvalBindData>(sequence);
	}